

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

void __thiscall
HPack::FieldLookupTable::FieldLookupTable(FieldLookupTable *this,quint32 maxSize,bool use)

{
  _Rb_tree_header *p_Var1;
  
  this->maxTableSize = maxSize;
  this->tableCapacity = maxSize;
  std::
  _Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ::_Deque_base(&(this->chunks).
                 super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
               );
  this->useIndex = use;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->searchIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->searchIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nDynamic = 0;
  this->begin = 0;
  this->end = 0;
  this->dataSize = 0;
  (this->dummyDst).d.d = (Data *)0x0;
  (this->dummyDst).d.ptr = (char *)0x0;
  (this->dummyDst).d.size = 0;
  return;
}

Assistant:

FieldLookupTable::FieldLookupTable(quint32 maxSize, bool use)
    : maxTableSize(maxSize),
      tableCapacity(maxSize),
      useIndex(use),
      nDynamic(),
      begin(),
      end(),
      dataSize()
{
}